

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__compute_crossings_x(float x,float y,int nverts,stbtt_vertex *verts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  int num_hits;
  float x_inter_1;
  float hits [2] [2];
  float q2 [2];
  float q1 [2];
  float q0 [2];
  int by;
  int ay;
  int ax;
  int y2;
  int x2;
  int y1_1;
  int x1_1;
  int y0_1;
  int x0_1;
  float x_inter;
  int y1;
  int x1;
  int y0;
  int x0;
  int winding;
  float y_frac;
  float ray [2];
  float orig [2];
  int i;
  int local_100;
  int local_f8;
  int local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_b8;
  int in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  float local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  float local_30;
  undefined8 local_2c;
  float local_20;
  int local_1c;
  long local_18;
  int local_c;
  float local_8;
  float local_4;
  
  local_2c = 0x3f800000;
  local_34 = 0;
  local_18 = in_RSI;
  local_c = in_EDI;
  local_8 = in_XMM1_Da;
  local_4 = in_XMM0_Da;
  dVar6 = fmod((double)in_XMM1_Da,1.0);
  local_30 = (float)dVar6;
  if (0.01 <= local_30) {
    if (0.99 < local_30) {
      local_8 = local_8 - 0.01;
    }
  }
  else {
    local_8 = local_8 + 0.01;
  }
  local_20 = local_8;
  for (local_1c = 0; local_1c < local_c; local_1c = local_1c + 1) {
    if (*(char *)(local_18 + (long)local_1c * 0xe + 0xc) == '\x02') {
      local_38 = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe);
      local_3c = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe + 2);
      local_40 = (int)*(short *)(local_18 + (long)local_1c * 0xe);
      local_44 = (int)*(short *)(local_18 + (long)local_1c * 0xe + 2);
      in_stack_ffffffffffffff58 = local_44;
      if (local_3c < local_44) {
        in_stack_ffffffffffffff58 = local_3c;
      }
      in_stack_ffffffffffffff5c = local_8;
      if ((float)in_stack_ffffffffffffff58 < local_8) {
        in_stack_ffffffffffffff50 = local_3c;
        if (local_3c < local_44) {
          in_stack_ffffffffffffff50 = local_44;
        }
        in_stack_ffffffffffffff54 = local_8;
        if (local_8 < (float)in_stack_ffffffffffffff50) {
          local_b8 = local_40;
          if (local_38 < local_40) {
            local_b8 = local_38;
          }
          if (((float)local_b8 < local_4) &&
             (local_48 = ((local_8 - (float)local_3c) / (float)(local_44 - local_3c)) *
                         (float)(local_40 - local_38) + (float)local_38, local_48 < local_4)) {
            iVar1 = -1;
            if (local_3c < local_44) {
              iVar1 = 1;
            }
            local_34 = iVar1 + local_34;
          }
        }
      }
    }
    if (*(char *)(local_18 + (long)local_1c * 0xe + 0xc) == '\x03') {
      local_4c = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe);
      local_50 = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe + 2);
      local_54 = (int)*(short *)(local_18 + (long)local_1c * 0xe + 4);
      local_58 = (int)*(short *)(local_18 + (long)local_1c * 0xe + 6);
      local_5c = (int)*(short *)(local_18 + (long)local_1c * 0xe);
      local_60 = (int)*(short *)(local_18 + (long)local_1c * 0xe + 2);
      local_c0 = local_5c;
      if (local_54 < local_5c) {
        local_c0 = local_54;
      }
      local_c4 = local_4c;
      if (local_c0 <= local_4c) {
        local_c8 = local_5c;
        if (local_54 < local_5c) {
          local_c8 = local_54;
        }
        local_c4 = local_c8;
      }
      local_64 = local_c4;
      local_d0 = local_60;
      if (local_58 < local_60) {
        local_d0 = local_58;
      }
      local_d4 = local_50;
      if (local_d0 <= local_50) {
        local_d8 = local_60;
        if (local_58 < local_60) {
          local_d8 = local_58;
        }
        local_d4 = local_d8;
      }
      local_68 = local_d4;
      local_e0 = local_58;
      if (local_58 < local_60) {
        local_e0 = local_60;
      }
      local_e8 = local_50;
      if (local_50 < local_e0) {
        local_e4 = local_58;
        if (local_58 < local_60) {
          local_e4 = local_60;
        }
        local_e8 = local_e4;
      }
      local_6c = local_e8;
      if ((((float)local_d4 < local_8) && (local_8 < (float)local_e8)) &&
         ((float)local_c4 < local_4)) {
        local_74 = (float)local_4c;
        local_70 = (float)local_50;
        local_7c = (float)local_54;
        local_78 = (float)local_58;
        fVar5 = (float)local_5c;
        iVar1 = equal(&local_74,&local_7c);
        if ((iVar1 == 0) && (iVar1 = equal(&local_7c,(float *)&stack0xffffffffffffff7c), iVar1 == 0)
           ) {
          in_stack_ffffffffffffff60 =
               stbtt__ray_intersect_bezier
                         ((float *)CONCAT44(fVar5,in_stack_ffffffffffffff78),
                          (float *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (float *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (float *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (float (*) [2])
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          if ((0 < in_stack_ffffffffffffff60) && (in_stack_ffffffffffffff68 < 0.0)) {
            iVar1 = 1;
            if (in_stack_ffffffffffffff6c < 0.0) {
              iVar1 = -1;
            }
            local_34 = iVar1 + local_34;
          }
          if ((1 < in_stack_ffffffffffffff60) && (in_stack_ffffffffffffff70 < 0.0)) {
            iVar1 = 1;
            if (in_stack_ffffffffffffff74 < 0.0) {
              iVar1 = -1;
            }
            local_34 = iVar1 + local_34;
          }
        }
        else {
          iVar1 = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe);
          iVar2 = (int)*(short *)(local_18 + (long)(local_1c + -1) * 0xe + 2);
          iVar3 = (int)*(short *)(local_18 + (long)local_1c * 0xe);
          iVar4 = (int)*(short *)(local_18 + (long)local_1c * 0xe + 2);
          local_f0 = iVar4;
          if (iVar2 < iVar4) {
            local_f0 = iVar2;
          }
          if ((float)local_f0 < local_8) {
            local_f8 = iVar2;
            if (iVar2 < iVar4) {
              local_f8 = iVar4;
            }
            if (local_8 < (float)local_f8) {
              local_100 = iVar3;
              if (iVar1 < iVar3) {
                local_100 = iVar1;
              }
              if (((float)local_100 < local_4) &&
                 (in_stack_ffffffffffffff64 =
                       ((local_8 - (float)iVar2) / (float)(iVar4 - iVar2)) * (float)(iVar3 - iVar1)
                       + (float)iVar1, in_stack_ffffffffffffff64 < local_4)) {
                iVar1 = -1;
                if (iVar2 < iVar4) {
                  iVar1 = 1;
                }
                local_34 = iVar1 + local_34;
              }
            }
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

static int stbtt__compute_crossings_x(float x, float y, int nverts, stbtt_vertex *verts)
{
int i;
float orig[2], ray[2] = { 1, 0 };
float y_frac;
int winding = 0;

orig[0] = x;
orig[1] = y;

/*  make sure y never passes through a vertex of the shape */
y_frac = (float) STBTT_fmod(y, 1.0f);
if (y_frac < 0.01f)
y += 0.01f;
else if (y_frac > 0.99f)
y -= 0.01f;
orig[1] = y;

/*  test a ray from (-infinity,y) to (x,y) */
for (i=0; i < nverts; ++i) {
if (verts[i].type == STBTT_vline) {
int x0 = (int) verts[i-1].x, y0 = (int) verts[i-1].y;
int x1 = (int) verts[i  ].x, y1 = (int) verts[i  ].y;
if (y > STBTT_min(y0,y1) && y < STBTT_max(y0,y1) && x > STBTT_min(x0,x1)) {
float x_inter = (y - y0) / (y1 - y0) * (x1-x0) + x0;
if (x_inter < x)
winding += (y0 < y1) ? 1 : -1;
}
}
if (verts[i].type == STBTT_vcurve) {
int x0 = (int) verts[i-1].x , y0 = (int) verts[i-1].y ;
int x1 = (int) verts[i  ].cx, y1 = (int) verts[i  ].cy;
int x2 = (int) verts[i  ].x , y2 = (int) verts[i  ].y ;
int ax = STBTT_min(x0,STBTT_min(x1,x2)), ay = STBTT_min(y0,STBTT_min(y1,y2));
int by = STBTT_max(y0,STBTT_max(y1,y2));
if (y > ay && y < by && x > ax) {
float q0[2],q1[2],q2[2];
float hits[2][2];
q0[0] = (float)x0;
q0[1] = (float)y0;
q1[0] = (float)x1;
q1[1] = (float)y1;
q2[0] = (float)x2;
q2[1] = (float)y2;
if (equal(q0,q1) || equal(q1,q2)) {
x0 = (int)verts[i-1].x;
y0 = (int)verts[i-1].y;
x1 = (int)verts[i  ].x;
y1 = (int)verts[i  ].y;
if (y > STBTT_min(y0,y1) && y < STBTT_max(y0,y1) && x > STBTT_min(x0,x1)) {
float x_inter = (y - y0) / (y1 - y0) * (x1-x0) + x0;
if (x_inter < x)
winding += (y0 < y1) ? 1 : -1;
}
} else {
int num_hits = stbtt__ray_intersect_bezier(orig, ray, q0, q1, q2, hits);
if (num_hits >= 1)
if (hits[0][0] < 0)
winding += (hits[0][1] < 0 ? -1 : 1);
if (num_hits >= 2)
if (hits[1][0] < 0)
winding += (hits[1][1] < 0 ? -1 : 1);
}
}
}
}
return winding;
}